

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,-1,3,1,-1,3>>::
resizeLike<Eigen::Matrix<float,_1,3,1,_1,3>>
          (PlainObjectBase<Eigen::Matrix<float,_1,3,1,_1,3>> *this,
          EigenBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *_other)

{
  long nbRows;
  
  nbRows = *(long *)(_other + 8);
  if (0x2aaaaaaaaaaaaaaa < nbRows) {
    internal::throw_std_bad_alloc();
    nbRows = *(long *)(_other + 8);
  }
  PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *)this,nbRows,3);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }